

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall absl::strings_internal::BigUnsigned<4>::MultiplyBy(BigUnsigned<4> *this,uint64_t v)

{
  uint32_t *in_RSI;
  undefined8 in_RDI;
  BigUnsigned<4> *unaff_retaddr;
  uint32_t words [2];
  uint32_t v_00;
  
  v_00 = (uint32_t)((ulong)in_RDI >> 0x20);
  if ((int)((ulong)in_RSI >> 0x20) == 0) {
    MultiplyBy(unaff_retaddr,v_00);
  }
  else {
    MultiplyBy(unaff_retaddr,v_00,in_RSI);
  }
  return;
}

Assistant:

void MultiplyBy(uint64_t v) {
    uint32_t words[2];
    words[0] = static_cast<uint32_t>(v);
    words[1] = static_cast<uint32_t>(v >> 32);
    if (words[1] == 0) {
      MultiplyBy(words[0]);
    } else {
      MultiplyBy(2, words);
    }
  }